

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

void faup_snapshot_item_debug(faup_snapshot_item_t *item)

{
  faup_snapshot_value_count_t *local_20;
  faup_snapshot_value_count_t *vc;
  htable_iter iter;
  faup_snapshot_item_t *item_local;
  
  iter.off = (size_t)item;
  if (item == (faup_snapshot_item_t *)0x0) {
    printf("** item empty, cannot debug!\n");
  }
  else {
    printf("** \titem\n");
    printf("** \tkey:%s\n",*(undefined8 *)iter.off);
    printf("** \tlength:%ld\n",*(undefined8 *)(iter.off + 0x60));
    if (*(long *)(iter.off + 0x60) != 0) {
      local_20 = (faup_snapshot_value_count_t *)
                 htable_first((htable *)(iter.off + 8),(htable_iter *)&vc);
      while (local_20 != (faup_snapshot_value_count_t *)0x0) {
        faup_snapshot_value_count_debug(local_20);
        local_20 = (faup_snapshot_value_count_t *)
                   htable_next((htable *)(iter.off + 8),(htable_iter *)&vc);
      }
    }
  }
  return;
}

Assistant:

void faup_snapshot_item_debug(faup_snapshot_item_t *item)
{
  struct htable_iter iter;
  faup_snapshot_value_count_t *vc;
  
  if (!item) {
    printf("** item empty, cannot debug!\n");
    return;
  }
  
  printf("** \titem\n");
  printf("** \tkey:%s\n", item->key);
  printf("** \tlength:%ld\n", item->length);

  if (item->length) {
    vc = htable_first(&item->values, &iter);
    while (vc) {
      faup_snapshot_value_count_debug(vc);
      vc = htable_next(&item->values, &iter);
    }
  }
}